

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O0

uint __thiscall
gui::Signal<gui::Widget*,unsigned_long>::
connect<gui::ColorPicker::ColorPicker(gui::Theme_const&,sf::String_const&)::__6>
          (Signal<gui::Widget_*,_unsigned_long> *this,anon_class_8_1_8991fb9c *func)

{
  uint uVar1;
  size_type sVar2;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_unsigned_long>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_unsigned_long>_>_>_>
  *in_RSI;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  
  while( true ) {
    sVar2 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_unsigned_long>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_unsigned_long>_>_>_>
            ::count(in_RSI,(key_type *)CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8)
                   );
    if (sVar2 == 0) break;
    priv::signalIdCounter = priv::signalIdCounter + 1;
  }
  std::
  map<unsigned_int,gui::Callback<gui::Widget*,unsigned_long>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,gui::Callback<gui::Widget*,unsigned_long>>>>
  ::emplace<unsigned_int&,gui::ColorPicker::ColorPicker(gui::Theme_const&,sf::String_const&)::__6>
            (in_RSI,(uint *)CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe0);
  uVar1 = priv::signalIdCounter;
  priv::signalIdCounter = priv::signalIdCounter + 1;
  return uVar1;
}

Assistant:

unsigned int connect(F&& func) {
        // Using perfect forwarding has the drawback of creating very long error
        // messages when types don't line up. Verify the argument type here
        // before continuing.
        static_assert(
            std::is_constructible<Callback<Targs...>, F>::value,
            "Cannot convert argument \'func\' to a Callback, check the function signature."
        );

        while (callbacks_.count(priv::signalIdCounter)) {
            ++priv::signalIdCounter;
        }
        callbacks_.emplace(priv::signalIdCounter, std::forward<F>(func));

        return priv::signalIdCounter++;
    }